

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv_thread_getpriority(uv_thread_t tid,int *priority)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  pthread_t __thread2;
  sched_param local_2c;
  pid_t pid;
  sched_param param;
  int policy;
  int r;
  int *priority_local;
  uv_thread_t tid_local;
  
  lVar2 = syscall(0xba);
  if (priority == (int *)0x0) {
    tid_local._4_4_ = -0x16;
  }
  else {
    param.sched_priority = pthread_getschedparam(tid,&pid,&local_2c);
    if (param.sched_priority == 0) {
      if (pid == 0) {
        __thread2 = pthread_self();
        iVar1 = pthread_equal(tid,__thread2);
        if (iVar1 != 0) {
          piVar3 = __errno_location();
          *piVar3 = 0;
          param.sched_priority = getpriority(PRIO_PROCESS,(id_t)lVar2);
          if ((param.sched_priority == -1) && (piVar3 = __errno_location(), *piVar3 != 0)) {
            piVar3 = __errno_location();
            return -*piVar3;
          }
          *priority = param.sched_priority;
          return 0;
        }
      }
      *priority = local_2c.__sched_priority;
      tid_local._4_4_ = 0;
    }
    else {
      piVar3 = __errno_location();
      tid_local._4_4_ = -*piVar3;
    }
  }
  return tid_local._4_4_;
}

Assistant:

int uv_thread_getpriority(uv_thread_t tid, int* priority) {
  int r;
  int policy;
  struct sched_param param;
#ifdef __linux__
  pid_t pid = gettid();
#endif

  if (priority == NULL)
    return UV_EINVAL;

  r = pthread_getschedparam(tid, &policy, &param);
  if (r != 0)
    return UV__ERR(errno);

#ifdef __linux__
  if (SCHED_OTHER == policy && pthread_equal(tid, pthread_self())) {
    errno = 0;
    r = getpriority(PRIO_PROCESS, pid);
    if (r == -1 && errno != 0)
      return UV__ERR(errno);
    *priority = r;
    return 0;
  }
#endif

  *priority = param.sched_priority;
  return 0;
}